

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveRestartForPatchesSupportedCase::iterate
          (PrimitiveRestartForPatchesSupportedCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  bool *pbVar4;
  allocator<char> local_ea;
  allocator<char> local_e9;
  ScopedLogSection subsection;
  CallLogWrapper gl;
  QueriedState state;
  string local_a0;
  string local_80;
  ResultCollector result;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state," // ERROR: ",(allocator<char> *)&local_a0);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&state);
  std::__cxx11::string::~string((string *)&state);
  deqp::gls::StateQueryUtil::QueriedState::QueriedState(&state);
  gl.m_enableLog = true;
  deqp::gls::StateQueryUtil::queryState(&result,&gl,QUERY_BOOLEAN,0x8221,&state);
  bVar2 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&state);
  if (!bVar2) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Types",&local_e9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Alternative types",&local_ea);
    tcu::ScopedLogSection::ScopedLogSection(&subsection,pTVar1,&local_a0,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    pbVar4 = deqp::gls::StateQueryUtil::QueriedState::getBoolAccess(&state);
    deqp::gls::StateQueryUtil::verifyStateBoolean(&result,&gl,0x8221,*pbVar4,QUERY_INTEGER);
    pbVar4 = deqp::gls::StateQueryUtil::QueriedState::getBoolAccess(&state);
    deqp::gls::StateQueryUtil::verifyStateBoolean(&result,&gl,0x8221,*pbVar4,QUERY_INTEGER64);
    pbVar4 = deqp::gls::StateQueryUtil::QueriedState::getBoolAccess(&state);
    deqp::gls::StateQueryUtil::verifyStateBoolean(&result,&gl,0x8221,*pbVar4,QUERY_FLOAT);
    tcu::ScopedLogSection::~ScopedLogSection(&subsection);
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

PrimitiveRestartForPatchesSupportedCase::IterateResult PrimitiveRestartForPatchesSupportedCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	QueriedState			state;

	gl.enableLogging(true);

	queryState(result, gl, QUERY_BOOLEAN, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state);

	if (!state.isUndefined())
	{
		const tcu::ScopedLogSection	subsection(m_testCtx.getLog(), "Types", "Alternative types");
		verifyStateBoolean(result, gl, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state.getBoolAccess(), QUERY_INTEGER);
		verifyStateBoolean(result, gl, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state.getBoolAccess(), QUERY_INTEGER64);
		verifyStateBoolean(result, gl, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state.getBoolAccess(), QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}